

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SemanticAnalyserTests.cpp
# Opt level: O0

void __thiscall
SemanticAnalyserTest_FunctionDefinitionsThrows_Test::
~SemanticAnalyserTest_FunctionDefinitionsThrows_Test
          (SemanticAnalyserTest_FunctionDefinitionsThrows_Test *this)

{
  void *in_RDI;
  
  ~SemanticAnalyserTest_FunctionDefinitionsThrows_Test
            ((SemanticAnalyserTest_FunctionDefinitionsThrows_Test *)0x1e8b98);
  operator_delete(in_RDI,0x10);
  return;
}

Assistant:

TEST(SemanticAnalyserTest, FunctionDefinitionsThrows)
{
  std::string source = R"SRC(
  fn f(x: f32): f32 { ret 1; }
  fn g(x: f32, y: f32): f32 { ret x + y; }

  fn main(): f32
  {
    ret 0;
  }
  )SRC";
  nothrowTest(source);
}